

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_geom(REF_NODE ref_node,REF_GEOM ref_geom,REF_INT version,REF_INT type,FILE *file)

{
  uint uVar1;
  size_t sVar2;
  REF_DBL local_f8;
  long local_f0;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  double double_gref;
  void *pvStack_68;
  REF_INT proc;
  REF_DBL *param;
  REF_GLOB *node_id;
  long lStack_50;
  REF_INT ngeom;
  REF_GLOB node;
  REF_INT local_40;
  REF_INT i;
  REF_INT id;
  REF_INT geom;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_INT type_local;
  REF_INT version_local;
  REF_GEOM ref_geom_local;
  REF_NODE ref_node_local;
  
  _id = ref_node->ref_mpi;
  ref_mpi = (REF_MPI)file;
  file_local._0_4_ = type;
  file_local._4_4_ = version;
  _type_local = ref_geom;
  ref_geom_local = (REF_GEOM)ref_node;
  if (_id->id == 0) {
    for (i = 0; i < _type_local->max; i = i + 1) {
      if (((REF_INT)file_local == _type_local->descr[i * 6]) &&
         (_id->id ==
          *(int *)((long)ref_geom_local->initial_cell_height +
                  (long)_type_local->descr[i * 6 + 5] * 4))) {
        if ((_type_local->descr[i * 6 + 5] < 0) ||
           ((ref_geom_local->max <= _type_local->descr[i * 6 + 5] ||
            (*(long *)(ref_geom_local->descr + (long)_type_local->descr[i * 6 + 5] * 2) < 0)))) {
          local_f0 = -1;
        }
        else {
          local_f0 = *(long *)(ref_geom_local->descr + (long)_type_local->descr[i * 6 + 5] * 2);
        }
        lStack_50 = local_f0 + 1;
        local_40 = _type_local->descr[i * 6 + 1];
        _ref_private_macro_code_rss_1 = (double)_type_local->descr[i * 6 + 2];
        uVar1 = ref_gather_meshb_glob((FILE *)ref_mpi,file_local._4_4_,lStack_50);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x864,"ref_gather_geom",(ulong)uVar1,"node");
          return uVar1;
        }
        uVar1 = ref_gather_meshb_int((FILE *)ref_mpi,file_local._4_4_,local_40);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x865,"ref_gather_geom",(ulong)uVar1,"id");
          return uVar1;
        }
        for (node._4_4_ = 0; node._4_4_ < (REF_INT)file_local; node._4_4_ = node._4_4_ + 1) {
          sVar2 = fwrite(_type_local->param + (node._4_4_ + i * 2),8,1,(FILE *)ref_mpi);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x86a,"ref_gather_geom","id",1,sVar2);
            return 1;
          }
        }
        if ((0 < (REF_INT)file_local) &&
           (sVar2 = fwrite(&ref_private_macro_code_rss_1,8,1,(FILE *)ref_mpi), sVar2 != 1)) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x86c,"ref_gather_geom","id",1,sVar2);
          return 1;
        }
      }
    }
  }
  if (_id->id == 0) {
    for (double_gref._4_4_ = 1; double_gref._4_4_ < _id->n;
        double_gref._4_4_ = double_gref._4_4_ + 1) {
      uVar1 = ref_mpi_gather_recv(_id,(void *)((long)&node_id + 4),1,1,double_gref._4_4_);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x873,"ref_gather_geom",(ulong)uVar1,"recv ngeom");
        return uVar1;
      }
      if (0 < node_id._4_4_) {
        if (node_id._4_4_ * 3 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x875,"ref_gather_geom","malloc node_id of REF_GLOB negative");
          return 1;
        }
        param = (REF_DBL *)malloc((long)(node_id._4_4_ * 3) << 3);
        if (param == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x875,"ref_gather_geom","malloc node_id of REF_GLOB NULL");
          return 2;
        }
        if (node_id._4_4_ * 2 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x876,"ref_gather_geom","malloc param of REF_DBL negative");
          return 1;
        }
        pvStack_68 = malloc((long)(node_id._4_4_ << 1) << 3);
        if (pvStack_68 == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x876,"ref_gather_geom","malloc param of REF_DBL NULL");
          return 2;
        }
        uVar1 = ref_mpi_gather_recv(_id,param,node_id._4_4_ * 3,2,double_gref._4_4_);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x879,"ref_gather_geom",(ulong)uVar1,"recv node_id");
          return uVar1;
        }
        uVar1 = ref_mpi_gather_recv(_id,pvStack_68,node_id._4_4_ << 1,3,double_gref._4_4_);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x87b,"ref_gather_geom",(ulong)uVar1,"recv param");
          return uVar1;
        }
        for (i = 0; i < node_id._4_4_; i = i + 1) {
          lStack_50 = (long)param[i * 3] + 1;
          local_40 = SUB84(param[i * 3 + 1],0);
          _ref_private_macro_code_rss_1 = (double)(long)param[i * 3 + 2];
          uVar1 = ref_gather_meshb_glob((FILE *)ref_mpi,file_local._4_4_,lStack_50);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x880,"ref_gather_geom",(ulong)uVar1,"node");
            return uVar1;
          }
          uVar1 = ref_gather_meshb_int((FILE *)ref_mpi,file_local._4_4_,local_40);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x881,"ref_gather_geom",(ulong)uVar1,"id");
            return uVar1;
          }
          for (node._4_4_ = 0; node._4_4_ < (REF_INT)file_local; node._4_4_ = node._4_4_ + 1) {
            sVar2 = fwrite((void *)((long)pvStack_68 + (long)(node._4_4_ + i * 2) * 8),8,1,
                           (FILE *)ref_mpi);
            if (sVar2 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x884,"ref_gather_geom","id",1,sVar2);
              return 1;
            }
          }
          if ((0 < (REF_INT)file_local) &&
             (sVar2 = fwrite(&ref_private_macro_code_rss_1,8,1,(FILE *)ref_mpi), sVar2 != 1)) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x886,"ref_gather_geom","id",1,sVar2);
            return 1;
          }
        }
        if (pvStack_68 != (void *)0x0) {
          free(pvStack_68);
        }
        if (param != (REF_DBL *)0x0) {
          free(param);
        }
      }
    }
  }
  else {
    node_id._4_4_ = 0;
    for (i = 0; i < _type_local->max; i = i + 1) {
      if (((REF_INT)file_local == _type_local->descr[i * 6]) &&
         (_id->id ==
          *(int *)((long)ref_geom_local->initial_cell_height +
                  (long)_type_local->descr[i * 6 + 5] * 4))) {
        node_id._4_4_ = node_id._4_4_ + 1;
      }
    }
    uVar1 = ref_mpi_gather_send(_id,(void *)((long)&node_id + 4),1,1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x894,"ref_gather_geom",(ulong)uVar1,"send ngeom");
      return uVar1;
    }
    if (0 < node_id._4_4_) {
      if (node_id._4_4_ * 3 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x896,"ref_gather_geom","malloc node_id of REF_GLOB negative");
        return 1;
      }
      param = (REF_DBL *)malloc((long)(node_id._4_4_ * 3) << 3);
      if (param == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x896,"ref_gather_geom","malloc node_id of REF_GLOB NULL");
        return 2;
      }
      if (node_id._4_4_ * 2 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x897,"ref_gather_geom","malloc param of REF_DBL negative");
        return 1;
      }
      pvStack_68 = malloc((long)(node_id._4_4_ << 1) << 3);
      if (pvStack_68 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x897,"ref_gather_geom","malloc param of REF_DBL NULL");
        return 2;
      }
      for (ref_private_macro_code_rss_9 = 0;
          SBORROW4(ref_private_macro_code_rss_9,node_id._4_4_ * 2) !=
          ref_private_macro_code_rss_9 + node_id._4_4_ * -2 < 0;
          ref_private_macro_code_rss_9 = ref_private_macro_code_rss_9 + 1) {
        *(undefined8 *)((long)pvStack_68 + (long)ref_private_macro_code_rss_9 * 8) = 0;
      }
      node_id._4_4_ = 0;
      for (i = 0; i < _type_local->max; i = i + 1) {
        if (((REF_INT)file_local == _type_local->descr[i * 6]) &&
           (_id->id ==
            *(int *)((long)ref_geom_local->initial_cell_height +
                    (long)_type_local->descr[i * 6 + 5] * 4))) {
          if ((_type_local->descr[i * 6 + 5] < 0) ||
             ((ref_geom_local->max <= _type_local->descr[i * 6 + 5] ||
              (*(long *)(ref_geom_local->descr + (long)_type_local->descr[i * 6 + 5] * 2) < 0)))) {
            local_f8 = -NAN;
          }
          else {
            local_f8 = *(REF_DBL *)(ref_geom_local->descr + (long)_type_local->descr[i * 6 + 5] * 2)
            ;
          }
          param[node_id._4_4_ * 3] = local_f8;
          param[node_id._4_4_ * 3 + 1] = (REF_DBL)(long)_type_local->descr[i * 6 + 1];
          param[node_id._4_4_ * 3 + 2] = (REF_DBL)(long)_type_local->descr[i * 6 + 2];
          for (node._4_4_ = 0; node._4_4_ < (REF_INT)file_local; node._4_4_ = node._4_4_ + 1) {
            *(REF_DBL *)((long)pvStack_68 + (long)(node._4_4_ + node_id._4_4_ * 2) * 8) =
                 _type_local->param[node._4_4_ + i * 2];
          }
          node_id._4_4_ = node_id._4_4_ + 1;
        }
      }
      uVar1 = ref_mpi_gather_send(_id,param,node_id._4_4_ * 3,2);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x8a6,"ref_gather_geom",(ulong)uVar1,"send node_id");
        return uVar1;
      }
      uVar1 = ref_mpi_gather_send(_id,pvStack_68,node_id._4_4_ << 1,3);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x8a8,"ref_gather_geom",(ulong)uVar1,"send param");
        return uVar1;
      }
      if (pvStack_68 != (void *)0x0) {
        free(pvStack_68);
      }
      if (param != (REF_DBL *)0x0) {
        free(param);
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_geom(REF_NODE ref_node, REF_GEOM ref_geom,
                                          REF_INT version, REF_INT type,
                                          FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT geom, id, i;
  REF_GLOB node;
  REF_INT ngeom;
  REF_GLOB *node_id;
  REF_DBL *param;
  REF_INT proc;
  double double_gref;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_geom_of(ref_geom, type, geom) {
      if (ref_mpi_rank(ref_mpi) !=
          ref_node_part(ref_node, ref_geom_node(ref_geom, geom)))
        continue;
      node = ref_node_global(ref_node, ref_geom_node(ref_geom, geom)) + 1;
      id = ref_geom_id(ref_geom, geom);
      double_gref = (double)ref_geom_gref(ref_geom, geom);
      RSS(ref_gather_meshb_glob(file, version, node), "node");
      RSS(ref_gather_meshb_int(file, version, id), "id");
      for (i = 0; i < type; i++)
        REIS(1,
             fwrite(&(ref_geom_param(ref_geom, i, geom)), sizeof(double), 1,
                    file),
             "id");
      if (0 < type)
        REIS(1, fwrite(&(double_gref), sizeof(double), 1, file), "id");
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ngeom, 1, REF_INT_TYPE, proc),
          "recv ngeom");
      if (ngeom > 0) {
        ref_malloc(node_id, 3 * ngeom, REF_GLOB);
        ref_malloc(param, 2 * ngeom, REF_DBL);
        RSS(ref_mpi_gather_recv(ref_mpi, node_id, 3 * ngeom, REF_GLOB_TYPE,
                                proc),
            "recv node_id");
        RSS(ref_mpi_gather_recv(ref_mpi, param, 2 * ngeom, REF_DBL_TYPE, proc),
            "recv param");
        for (geom = 0; geom < ngeom; geom++) {
          node = node_id[0 + 3 * geom] + 1;
          id = (REF_INT)node_id[1 + 3 * geom];
          double_gref = (double)node_id[2 + 3 * geom];
          RSS(ref_gather_meshb_glob(file, version, node), "node");
          RSS(ref_gather_meshb_int(file, version, id), "id");
          for (i = 0; i < type; i++)
            REIS(1, fwrite(&(param[i + 2 * geom]), sizeof(double), 1, file),
                 "id");
          if (0 < type)
            REIS(1, fwrite(&(double_gref), sizeof(double), 1, file), "id");
        }
        ref_free(param);
        ref_free(node_id);
      }
    }
  } else {
    ngeom = 0;
    each_ref_geom_of(ref_geom, type, geom) {
      if (ref_mpi_rank(ref_mpi) !=
          ref_node_part(ref_node, ref_geom_node(ref_geom, geom)))
        continue;
      ngeom++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ngeom, 1, REF_INT_TYPE), "send ngeom");
    if (ngeom > 0) {
      ref_malloc(node_id, 3 * ngeom, REF_GLOB);
      ref_malloc_init(param, 2 * ngeom, REF_DBL, 0.0); /* prevent uninit */
      ngeom = 0;
      each_ref_geom_of(ref_geom, type, geom) {
        if (ref_mpi_rank(ref_mpi) !=
            ref_node_part(ref_node, ref_geom_node(ref_geom, geom)))
          continue;
        node_id[0 + 3 * ngeom] =
            ref_node_global(ref_node, ref_geom_node(ref_geom, geom));
        node_id[1 + 3 * ngeom] = (REF_GLOB)ref_geom_id(ref_geom, geom);
        node_id[2 + 3 * ngeom] = (REF_GLOB)ref_geom_gref(ref_geom, geom);
        for (i = 0; i < type; i++)
          param[i + 2 * ngeom] = ref_geom_param(ref_geom, i, geom);
        ngeom++;
      }
      RSS(ref_mpi_gather_send(ref_mpi, node_id, 3 * ngeom, REF_GLOB_TYPE),
          "send node_id");
      RSS(ref_mpi_gather_send(ref_mpi, param, 2 * ngeom, REF_DBL_TYPE),
          "send param");
      ref_free(param);
      ref_free(node_id);
    }
  }

  return REF_SUCCESS;
}